

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O2

ByteData * __thiscall
cfd::core::ByteData160::PushBack<cfd::core::ByteData160>
          (ByteData *__return_storage_ptr__,ByteData160 *this,ByteData160 *back_insert_data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> insert_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,&this->data_);
  cfd::core::ByteData160::GetBytes();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,
             (const_iterator)local_28._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_40._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_40._M_impl.super__Vector_impl_data._M_finish);
  cfd::core::ByteData::ByteData(__return_storage_ptr__,(vector *)&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData PushBack(const ByteDataClass& back_insert_data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = back_insert_data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }